

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::setCapacity
          (Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *this,
          size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x18)) {
    ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::truncate
              (&this->builder,(char *)newSize,lVar1 % 0x18);
  }
  newBuilder.ptr =
       _::HeapArrayDisposer::
       allocateUninitialized<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>
                 (newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>::
  addAll<kj::ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry>>
            ((ArrayBuilder<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry> *)
             &newBuilder,&this->builder);
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::operator=
            (&this->builder,&newBuilder);
  ArrayBuilder<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::dispose
            (&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }